

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_regressor.cc
# Opt level: O3

void save_load_header(vw *all,io_buf *model_file,bool read,bool text,string *file_options,
                     options_i *options)

{
  string *__rhs;
  pointer pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  pointer pcVar3;
  size_type sVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  char cVar7;
  bool bVar8;
  int iVar9;
  uint32_t uVar10;
  uint uVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar12;
  ostream *poVar13;
  size_t sVar14;
  size_t sVar15;
  size_t sVar16;
  size_t sVar17;
  undefined8 *puVar18;
  size_t sVar19;
  long *plVar20;
  vw_exception *pvVar21;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  undefined **ppuVar23;
  long *plVar24;
  byte *pbVar25;
  uint uVar26;
  uint uVar27;
  ulong uVar28;
  ulong uVar29;
  uint uVar30;
  char cVar31;
  uint uVar32;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var33;
  char *pcVar34;
  int iVar35;
  long lVar36;
  vw *pvVar37;
  shared_ptr<VW::config::base_option> *option;
  long lVar38;
  _Alloc_hider _Var39;
  uint32_t ngram_len;
  uint32_t len;
  uint32_t pair_len;
  uint32_t skip_len;
  uint32_t local_num_bits;
  char model;
  char *buff2;
  uint32_t triple_len;
  size_t buf2_size;
  stringstream temp;
  stringstream msg;
  undefined4 local_448;
  uint local_444;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  vw *local_418;
  string *local_410;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_408;
  version_struct *local_400;
  long *local_3f8;
  long local_3f0;
  long local_3e8;
  long lStack_3e0;
  uint local_3d4;
  uint32_t local_3d0;
  char local_3c9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_3c8;
  options_i *local_3c0;
  char *local_3b8;
  uint local_3b0;
  char local_3a8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_398;
  size_t local_390;
  undefined1 local_388 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378 [7];
  ios_base local_308 [8];
  ios_base local_300 [264];
  stringstream local_1f8 [16];
  undefined1 local_1e8 [376];
  string local_70;
  string local_50;
  
  local_410 = file_options;
  local_3c0 = options;
  pvVar12 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)malloc(0x200);
  local_390 = 0x200;
  local_3c8 = pvVar12;
  if ((model_file->files)._end != (model_file->files)._begin) {
    version_struct::to_string_abi_cxx11_((string *)local_388,&version);
    uVar6 = local_388._8_4_;
    if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
      operator_delete((void *)local_388._0_8_);
    }
    local_440 = pvVar12;
    std::__cxx11::stringstream::stringstream(local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"Version ",8);
    version_struct::to_string_abi_cxx11_((string *)local_388,&version);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1e8,(char *)local_388._0_8_,local_388._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
    if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
      operator_delete((void *)local_388._0_8_);
    }
    version_struct::to_string_abi_cxx11_((string *)local_388,&version);
    uVar5 = local_388._0_8_;
    uVar30 = uVar6 + 1;
    uVar11 = 0x200;
    if (uVar30 < 0x200) {
      uVar11 = uVar30;
    }
    memcpy(local_440,(void *)local_388._0_8_,(ulong)uVar11);
    if ((undefined1 *)uVar5 != local_388 + 0x10) {
      operator_delete((void *)uVar5);
    }
    if (read) {
      *(char *)((long)(local_440 + 0x15) + 7) = '\0';
      sVar14 = bin_read(model_file,(char *)local_440,0x200,"");
    }
    else {
      sVar14 = bin_text_write(model_file,(char *)local_440,(ulong)uVar30,(stringstream *)local_1f8,
                              text);
    }
    local_400 = &all->model_file_ver;
    __isoc99_sscanf(local_440,"%d.%d.%d",local_400,&(all->model_file_ver).minor,
                    &(all->model_file_ver).rev);
    VW::validate_version(all);
    bVar8 = version_struct::operator>=(local_400,"8.0.2");
    if (bVar8) {
      model_file->_verify_hash = true;
    }
    bVar8 = version_struct::operator>=(local_400,"8.0.3");
    if (bVar8) {
      sVar4 = (all->id)._M_string_length;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"Id ",3);
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1e8,(all->id)._M_dataplus._M_p,
                           (all->id)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
      pvVar12 = local_440;
      __rhs = &all->id;
      uVar30 = (int)sVar4 + 1;
      uVar11 = 0x200;
      if (uVar30 < 0x200) {
        uVar11 = uVar30;
      }
      memcpy(local_440,(__rhs->_M_dataplus)._M_p,(ulong)uVar11);
      if (read) {
        sVar15 = bin_read(model_file,(char *)pvVar12,0x200,"");
      }
      else {
        sVar15 = bin_text_write(model_file,(char *)pvVar12,(ulong)uVar30,(stringstream *)local_1f8,
                                text);
      }
      pvVar12 = local_440;
      pcVar34 = (char *)(all->id)._M_string_length;
      strlen((char *)local_440);
      std::__cxx11::string::_M_replace((ulong)__rhs,0,pcVar34,(ulong)pvVar12);
      sVar14 = sVar15 + sVar14;
      if (read) {
        local_388._0_8_ = local_388 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"id","");
        iVar9 = (*local_3c0->_vptr_options_i[1])(local_3c0,local_388);
        sVar4 = (all->id)._M_string_length;
        if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
          operator_delete((void *)local_388._0_8_);
        }
        if ((char)iVar9 == '\0' && sVar4 != 0) {
          std::__cxx11::string::append((char *)local_410);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_388," ",__rhs);
          std::__cxx11::string::_M_append((char *)local_410,local_388._0_8_);
          if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
            operator_delete((void *)local_388._0_8_);
          }
        }
      }
    }
    local_3c9 = 'm';
    local_444 = (uint)read;
    sVar15 = bin_text_read_write_fixed_validated
                       (model_file,&local_3c9,1,"file is not a model file",read,
                        (stringstream *)local_1f8,text);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"Min label:",10);
    poVar13 = std::ostream::_M_insert<double>((double)all->sd->min_label);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
    local_408 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)bin_text_read_write_fixed_validated
                             (model_file,(char *)&all->sd->min_label,4,"",SUB41(local_444,0),
                              (stringstream *)local_1f8,text);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"Max label:",10);
    poVar13 = std::ostream::_M_insert<double>((double)all->sd->max_label);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
    sVar16 = bin_text_read_write_fixed_validated
                       (model_file,(char *)&all->sd->max_label,4,"",SUB41(local_444,0),
                        (stringstream *)local_1f8,text);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"bits:",5);
    poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)local_1e8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
    local_3d0 = all->num_bits;
    local_418 = all;
    sVar17 = bin_text_read_write_fixed_validated
                       (model_file,(char *)&local_3d0,4,"",SUB41(local_444,0),
                        (stringstream *)local_1f8,text);
    if (read) {
      local_388._0_8_ = local_388 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"bit_precision","");
      iVar9 = (*local_3c0->_vptr_options_i[1])(local_3c0,local_388);
      if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
        operator_delete((void *)local_388._0_8_);
      }
      if ((char)iVar9 == '\0') {
        std::__cxx11::string::append((char *)local_410);
        std::__cxx11::stringstream::stringstream((stringstream *)local_388);
        std::ostream::_M_insert<unsigned_long>((ulong)(local_388 + 0x10));
        std::__cxx11::stringbuf::str();
        puVar18 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_3f8,0,(char *)0x0,0x27aace);
        paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar18 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar18 == paVar22) {
          local_438.field_2._M_allocated_capacity = paVar22->_M_allocated_capacity;
          local_438.field_2._8_8_ = puVar18[3];
          local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
        }
        else {
          local_438.field_2._M_allocated_capacity = paVar22->_M_allocated_capacity;
          local_438._M_dataplus._M_p = (pointer)*puVar18;
        }
        local_438._M_string_length = puVar18[1];
        *puVar18 = paVar22;
        puVar18[1] = 0;
        *(undefined1 *)(puVar18 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_410,(ulong)local_438._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438._M_dataplus._M_p != &local_438.field_2) {
          operator_delete(local_438._M_dataplus._M_p);
        }
        if (local_3f8 != &local_3e8) {
          operator_delete(local_3f8);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_388);
        std::ios_base::~ios_base(local_308);
      }
    }
    VW::validate_default_bits(local_418,local_3d0);
    local_418->default_bits = false;
    local_418->num_bits = local_3d0;
    VW::validate_num_bits(local_418);
    bVar8 = version_struct::operator<(local_400,"7.10.3");
    pvVar37 = local_418;
    lVar36 = (long)&(local_408->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + sVar17 + sVar16 + sVar15 + sVar14;
    if (bVar8) {
      local_3f8 = (long *)CONCAT44(local_3f8._4_4_,
                                   (int)((ulong)((long)(local_418->pairs).
                                                                                                              
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)(local_418->pairs).
                                                                                                            
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 5));
      poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)local_1e8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13," pairs: ",8);
      sVar14 = bin_text_read_write_fixed_validated
                         (model_file,(char *)&local_3f8,4,"",SUB41(local_444,0),
                          (stringstream *)local_1f8,text);
      local_408 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(sVar14 + lVar36);
      if ((uint)local_3f8 != 0) {
        local_398 = &pvVar37->pairs;
        uVar29 = 0;
        do {
          local_3b8 = (char *)((ulong)local_3b8 & 0xffffffffff000000);
          if (!read) {
            pbVar1 = (local_398->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            pcVar34 = pbVar1[uVar29]._M_dataplus._M_p;
            local_3b8 = (char *)CONCAT62(local_3b8._2_6_,*(undefined2 *)pcVar34);
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e8,pcVar34,pbVar1[uVar29]._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
          }
          sVar14 = bin_text_read_write_fixed_validated
                             (model_file,(char *)&local_3b8,2,"",SUB41(local_444,0),
                              (stringstream *)local_1f8,text);
          if (read) {
            local_388._0_8_ = local_388 + 0x10;
            sVar19 = strlen((char *)&local_3b8);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_388,&local_3b8,(long)&local_3b8 + sVar19);
            _Var33._M_current =
                 (pvVar37->pairs).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            pbVar2 = (pvVar37->pairs).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            local_438._M_dataplus._M_p = (pointer)local_388;
            if (_Var33._M_current == pbVar2) {
LAB_0022e21f:
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(local_398,(value_type *)local_388);
            }
            else {
              lVar36 = 0;
              do {
                bVar8 = __gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>::operator()
                                  ((_Iter_equals_val<std::__cxx11::string_const> *)&local_438,_Var33
                                  );
                lVar36 = lVar36 + (ulong)bVar8;
                _Var33._M_current = _Var33._M_current + 1;
              } while (_Var33._M_current != pbVar2);
              pvVar37 = local_418;
              if (lVar36 == 0) goto LAB_0022e21f;
            }
            if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
              operator_delete((void *)local_388._0_8_);
            }
          }
          local_408 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&(local_408->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + sVar14);
          uVar29 = uVar29 + 1;
        } while (uVar29 < ((ulong)local_3f8 & 0xffffffff));
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"\n",1);
      pvVar12 = local_408;
      if (read) {
        sVar14 = 0;
      }
      else {
        sVar14 = bin_text_write_fixed(model_file,(char *)0x0,0,(stringstream *)local_1f8,text);
      }
      local_3b8 = (char *)CONCAT44(local_3b8._4_4_,
                                   (int)((ulong)((long)(pvVar37->triples).
                                                                                                              
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)(pvVar37->triples).
                                                                                                            
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 5));
      poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)local_1e8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13," triples: ",10);
      sVar15 = bin_text_read_write_fixed_validated
                         (model_file,(char *)&local_3b8,4,"",SUB41(local_444,0),
                          (stringstream *)local_1f8,text);
      pvVar12 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&(pvVar12->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + sVar15 + sVar14);
      if ((int)local_3b8 != 0) {
        local_408 = &pvVar37->triples;
        uVar29 = 0;
        do {
          local_448 = 0;
          if (!read) {
            pbVar1 = (local_408->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e8,pbVar1[uVar29]._M_dataplus._M_p,
                                 pbVar1[uVar29]._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
            pcVar3 = (local_408->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[uVar29]._M_dataplus._M_p;
            local_448 = CONCAT22(CONCAT11(local_448._3_1_,pcVar3[2]),*(undefined2 *)pcVar3);
          }
          sVar14 = bin_text_read_write_fixed_validated
                             (model_file,(char *)&local_448,3,"",SUB41(local_444,0),
                              (stringstream *)local_1f8,text);
          if (read) {
            local_388._0_8_ = local_388 + 0x10;
            local_398 = pvVar12;
            sVar19 = strlen((char *)&local_448);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_388,&local_448,(long)&local_448 + sVar19);
            _Var33._M_current =
                 (pvVar37->triples).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            pbVar2 = (pvVar37->triples).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            local_438._M_dataplus._M_p = (pointer)local_388;
            if (_Var33._M_current == pbVar2) {
LAB_0022e463:
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(local_408,(value_type *)local_388);
            }
            else {
              lVar36 = 0;
              do {
                bVar8 = __gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>::operator()
                                  ((_Iter_equals_val<std::__cxx11::string_const> *)&local_438,_Var33
                                  );
                lVar36 = lVar36 + (ulong)bVar8;
                _Var33._M_current = _Var33._M_current + 1;
              } while (_Var33._M_current != pbVar2);
              if (lVar36 == 0) goto LAB_0022e463;
            }
            pvVar12 = local_398;
            pvVar37 = local_418;
            if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
              operator_delete((void *)local_388._0_8_);
            }
          }
          pvVar12 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&(pvVar12->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start + sVar14);
          uVar29 = uVar29 + 1;
        } while (uVar29 < ((ulong)local_3b8 & 0xffffffff));
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"\n",1);
      if (read) {
        sVar14 = 0;
      }
      else {
        sVar14 = bin_text_write_fixed(model_file,(char *)0x0,0,(stringstream *)local_1f8,text);
      }
      bVar8 = version_struct::operator>=(local_400,"7.10.2");
      lVar36 = (long)&(pvVar12->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + sVar14;
      if (bVar8) {
        local_438._M_dataplus._M_p._0_4_ =
             (int)((ulong)((long)(pvVar37->interactions).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pvVar37->interactions).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 5);
        poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)local_1e8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13," interactions: ",0xf);
        sVar14 = bin_text_read_write_fixed_validated
                           (model_file,(char *)&local_438,4,"",SUB41(local_444,0),
                            (stringstream *)local_1f8,text);
        lVar36 = sVar14 + lVar36;
        if ((uint32_t)local_438._M_dataplus._M_p != 0) {
          pvVar12 = &pvVar37->interactions;
          lVar38 = 0;
          uVar29 = 0;
          do {
            local_448 = 0;
            if (!read) {
              local_448 = *(uint *)((long)&((pvVar12->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start)->
                                           _M_string_length + lVar38);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"len: ",5);
              poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)local_1e8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
            }
            local_408 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)bin_text_read_write_fixed_validated
                                     (model_file,(char *)&local_448,4,"",SUB41(local_444,0),
                                      (stringstream *)local_1f8,text);
            if (!read) {
              memcpy(local_440,
                     *(void **)((long)&(((pvVar12->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar38),(ulong)local_448);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1e8,"interaction: ",0xd);
              std::ostream::write(local_1e8,
                                  *(long *)((long)&(((pvVar12->
                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar38));
            }
            sVar14 = bin_text_read_write_fixed_validated
                               (model_file,(char *)local_440,(ulong)local_448,"",SUB41(local_444,0),
                                (stringstream *)local_1f8,text);
            if (read) {
              local_388._0_8_ = local_388 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_388,local_440,
                         (char *)((long)&(local_440->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start +
                                 (ulong)local_448));
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(pvVar12,(value_type *)local_388);
              if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
                operator_delete((void *)local_388._0_8_);
              }
            }
            lVar36 = (long)&(local_408->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + sVar14 + lVar36;
            uVar29 = uVar29 + 1;
            lVar38 = lVar38 + 0x20;
          } while (uVar29 < ((ulong)local_438._M_dataplus._M_p & 0xffffffff));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"\n",1);
        if (read) {
          sVar14 = 0;
        }
        else {
          sVar14 = bin_text_write_fixed(model_file,(char *)0x0,0,(stringstream *)local_1f8,text);
        }
        lVar36 = sVar14 + lVar36;
      }
      else {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &pvVar37->interactions,
                   (pvVar37->interactions).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (pvVar37->pairs).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   (pvVar37->pairs).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &pvVar37->interactions,
                   (pvVar37->interactions).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (pvVar37->triples).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   (pvVar37->triples).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      }
    }
    bVar8 = version_struct::operator<=(local_400,"7.8.0");
    if (bVar8) {
      local_3b8 = (char *)((ulong)local_3b8 & 0xffffffff00000000);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"rank:",5);
      poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)local_1e8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
      sVar14 = bin_text_read_write_fixed_validated
                         (model_file,(char *)&local_3b8,4,"",SUB41(local_444,0),
                          (stringstream *)local_1f8,text);
      if ((int)local_3b8 != 0) {
        local_388._0_8_ = local_388 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"rank","");
        iVar9 = (*local_3c0->_vptr_options_i[1])(local_3c0,local_388);
        pvVar37 = local_418;
        if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
          operator_delete((void *)local_388._0_8_);
        }
        if ((char)iVar9 == '\0') {
          std::__cxx11::string::append((char *)local_410);
          std::__cxx11::stringstream::stringstream((stringstream *)local_388);
          std::ostream::_M_insert<unsigned_long>((ulong)(local_388 + 0x10));
          std::__cxx11::stringbuf::str();
          puVar18 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_3f8,0,(char *)0x0,0x27aace);
          paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar18 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar18 == paVar22) {
            local_438.field_2._M_allocated_capacity = paVar22->_M_allocated_capacity;
            local_438.field_2._8_8_ = puVar18[3];
            local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
          }
          else {
            local_438.field_2._M_allocated_capacity = paVar22->_M_allocated_capacity;
            local_438._M_dataplus._M_p = (pointer)*puVar18;
          }
          local_438._M_string_length = puVar18[1];
          *puVar18 = paVar22;
          puVar18[1] = 0;
          *(undefined1 *)(puVar18 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_410,(ulong)local_438._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438._M_dataplus._M_p != &local_438.field_2) {
            operator_delete(local_438._M_dataplus._M_p);
          }
          if (local_3f8 != &local_3e8) {
            operator_delete(local_3f8);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)local_388);
          std::ios_base::~ios_base(local_308);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    (&(pvVar37->trace_message).super_ostream,
                     "WARNING: this model file contains \'rank: ",0x29);
          poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&pvVar37->trace_message);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar13,
                     "\' value but it will be ignored as another value specified via the command line."
                     ,0x4f);
          std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
          std::ostream::put((char)poVar13);
          std::ostream::flush();
        }
      }
      lVar36 = lVar36 + sVar14;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"lda:",4);
    poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)local_1e8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
    sVar14 = bin_text_read_write_fixed_validated
                       (model_file,(char *)&local_418->lda,4,"",SUB41(local_444,0),
                        (stringstream *)local_1f8,text);
    local_448 = (uint)((ulong)((long)(local_418->ngram_strings).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(local_418->ngram_strings).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 5);
    poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)local_1e8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13," ngram:",7);
    sVar15 = bin_text_read_write_fixed_validated
                       (model_file,(char *)&local_448,4,"",SUB41(local_444,0),
                        (stringstream *)local_1f8,text);
    local_440 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(sVar14 + lVar36 + sVar15);
    if (local_448 != 0) {
      pvVar12 = &local_418->ngram_strings;
      lVar36 = 8;
      uVar29 = 0;
      do {
        local_3f8 = (long *)((ulong)local_3f8 & 0xffffffff00000000);
        if (!read) {
          pbVar1 = (pvVar12->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e8,*(char **)((long)pbVar1 + lVar36 + -8),
                               *(long *)((long)&(pbVar1->_M_dataplus)._M_p + lVar36));
          std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
          pbVar1 = (pvVar12->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          uVar28 = *(ulong *)((long)&(pbVar1->_M_dataplus)._M_p + lVar36);
          if (2 < uVar28) {
            uVar28 = 3;
          }
          memcpy(&local_3f8,*(void **)((long)pbVar1 + lVar36 + -8),uVar28);
        }
        sVar14 = bin_text_read_write_fixed_validated
                           (model_file,(char *)&local_3f8,3,"",SUB41(local_444,0),
                            (stringstream *)local_1f8,text);
        if (read) {
          local_388._0_8_ = local_388 + 0x10;
          sVar19 = strlen((char *)&local_3f8);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_388,&local_3f8,(long)&local_3f8 + sVar19);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(pvVar12,(value_type *)local_388);
          std::__cxx11::string::append((char *)local_410);
          std::operator+(&local_438," ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_388);
          std::__cxx11::string::_M_append((char *)local_410,(ulong)local_438._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438._M_dataplus._M_p != &local_438.field_2) {
            operator_delete(local_438._M_dataplus._M_p);
          }
          if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
            operator_delete((void *)local_388._0_8_);
          }
        }
        local_440 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&(local_440->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start + sVar14);
        uVar29 = uVar29 + 1;
        lVar36 = lVar36 + 0x20;
      } while (uVar29 < local_448);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"\n",1);
    if (read) {
      sVar14 = 0;
    }
    else {
      sVar14 = bin_text_write_fixed(model_file,(char *)0x0,0,(stringstream *)local_1f8,text);
    }
    local_3d4 = (uint)((ulong)((long)(local_418->skip_strings).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(local_418->skip_strings).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 5);
    poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)local_1e8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13," skip:",6);
    sVar15 = bin_text_read_write_fixed_validated
                       (model_file,(char *)&local_3d4,4,"",SUB41(local_444,0),
                        (stringstream *)local_1f8,text);
    pcVar34 = (char *)((long)&(local_440->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + sVar15 + sVar14);
    iVar9 = (int)pcVar34;
    if (local_3d4 != 0) {
      local_440 = &local_418->skip_strings;
      lVar36 = 8;
      uVar29 = 0;
      do {
        local_3f8 = (long *)((ulong)local_3f8 & 0xffffffff00000000);
        if (!read) {
          pbVar1 = (local_440->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e8,*(char **)((long)pbVar1 + lVar36 + -8),
                               *(long *)((long)&(pbVar1->_M_dataplus)._M_p + lVar36));
          std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
          pbVar1 = (local_440->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          uVar28 = *(ulong *)((long)&(pbVar1->_M_dataplus)._M_p + lVar36);
          if (2 < uVar28) {
            uVar28 = 3;
          }
          memcpy(&local_3f8,*(void **)((long)pbVar1 + lVar36 + -8),uVar28);
        }
        sVar14 = bin_text_read_write_fixed_validated
                           (model_file,(char *)&local_3f8,3,"",SUB41(local_444,0),
                            (stringstream *)local_1f8,text);
        if (read) {
          local_388._0_8_ = local_388 + 0x10;
          sVar19 = strlen((char *)&local_3f8);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_388,&local_3f8,(long)&local_3f8 + sVar19);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(local_440,(value_type *)local_388);
          std::__cxx11::string::append((char *)local_410);
          std::operator+(&local_438," ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_388);
          std::__cxx11::string::_M_append((char *)local_410,(ulong)local_438._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438._M_dataplus._M_p != &local_438.field_2) {
            operator_delete(local_438._M_dataplus._M_p);
          }
          if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
            operator_delete((void *)local_388._0_8_);
          }
        }
        pcVar34 = pcVar34 + sVar14;
        iVar9 = (int)pcVar34;
        uVar29 = uVar29 + 1;
        lVar36 = lVar36 + 0x20;
      } while (uVar29 < local_3d4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"\n",1);
    if (read) {
      sVar14 = io_buf::bin_read_fixed(model_file,(char *)&local_3f8,4,"");
      if (sVar14 < 4) {
LAB_0022f59b:
        std::__cxx11::stringstream::stringstream((stringstream *)local_388);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_388 + 0x10),"bad model format!",0x11);
        pvVar21 = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (pvVar21,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/parse_regressor.cc"
                   ,0x1ce,&local_50);
        __cxa_throw(pvVar21,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      if (0x6400000 < (uint)local_3f8) goto LAB_0022f59b;
      resize_buf_if_needed((char **)&local_3c8,&local_390,(ulong)local_3f8 & 0xffffffff);
      pvVar12 = local_3c8;
      sVar15 = io_buf::bin_read_fixed(model_file,(char *)local_3c8,(ulong)local_3f8 & 0xffffffff,"")
      ;
      if ((uint)local_3f8 != 0) {
        local_440 = pvVar12;
        pcVar3 = (local_410->_M_dataplus)._M_p;
        local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_438,pcVar3,pcVar3 + local_410->_M_string_length);
        std::__cxx11::string::append((char *)&local_438);
        plVar20 = (long *)std::__cxx11::string::append((char *)&local_438);
        ppuVar23 = (undefined **)(plVar20 + 2);
        if ((undefined **)*plVar20 == ppuVar23) {
          local_378[0]._0_8_ = *ppuVar23;
          local_378[0]._8_8_ = plVar20[3];
          local_388._0_8_ = local_388 + 0x10;
        }
        else {
          local_378[0]._0_8_ = *ppuVar23;
          local_388._0_8_ = (undefined **)*plVar20;
        }
        local_388._8_8_ = plVar20[1];
        *plVar20 = (long)ppuVar23;
        plVar20[1] = 0;
        *(undefined1 *)(plVar20 + 2) = 0;
        std::__cxx11::string::operator=((string *)local_410,(string *)local_388);
        if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
          operator_delete((void *)local_388._0_8_);
        }
        pvVar12 = local_440;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438._M_dataplus._M_p != &local_438.field_2) {
          operator_delete(local_438._M_dataplus._M_p);
          pvVar12 = local_440;
        }
      }
      iVar35 = (int)sVar15 + (int)sVar14;
    }
    else {
      sVar14 = bin_text_write_fixed(model_file,(char *)0x0,0,(stringstream *)local_1f8,text);
      local_388._0_8_ = &PTR_add_002d38c8;
      std::__cxx11::stringstream::stringstream((stringstream *)(local_388 + 8));
      *(undefined8 *)(local_388 + *(long *)(local_388._8_8_ - 0x18) + 0x10) = 0xf;
      (*local_3c0->_vptr_options_i[3])(&local_438);
      sVar4 = local_438._M_string_length;
      if (local_438._M_dataplus._M_p != (pointer)local_438._M_string_length) {
        _Var39._M_p = local_438._M_dataplus._M_p;
        do {
          if ((*(char *)(*(size_type *)_Var39._M_p + 0x70) == '\x01') &&
             (iVar35 = (*local_3c0->_vptr_options_i[1])(local_3c0,*(size_type *)_Var39._M_p + 8),
             (char)iVar35 != '\0')) {
            VW::config::options_serializer_boost_po::add
                      ((options_serializer_boost_po *)local_388,*(base_option **)_Var39._M_p);
          }
          _Var39._M_p = _Var39._M_p + 0x10;
        } while (_Var39._M_p != (pointer)sVar4);
      }
      std::
      vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
      ::~vector((vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
                 *)&local_438);
      VW::config::options_serializer_boost_po::str_abi_cxx11_
                (&local_438,(options_serializer_boost_po *)local_388);
      pvVar37 = local_418;
      if ((local_418->save_resume == true) && (local_418->random_state != 0)) {
        std::__cxx11::string::append((char *)&local_438);
        uVar29 = pvVar37->random_state;
        cVar31 = '\x01';
        if (9 < uVar29) {
          uVar28 = uVar29;
          cVar7 = '\x04';
          do {
            cVar31 = cVar7;
            if (uVar28 < 100) {
              cVar31 = cVar31 + -2;
              goto LAB_0022f1d2;
            }
            if (uVar28 < 1000) {
              cVar31 = cVar31 + -1;
              goto LAB_0022f1d2;
            }
            if (uVar28 < 10000) goto LAB_0022f1d2;
            bVar8 = 99999 < uVar28;
            uVar28 = uVar28 / 10000;
            cVar7 = cVar31 + '\x04';
          } while (bVar8);
          cVar31 = cVar31 + '\x01';
        }
LAB_0022f1d2:
        local_3b8 = local_3a8;
        std::__cxx11::string::_M_construct((ulong)&local_3b8,cVar31);
        std::__detail::__to_chars_10_impl<unsigned_long>(local_3b8,local_3b0,uVar29);
        plVar20 = (long *)std::__cxx11::string::replace((ulong)&local_3b8,0,(char *)0x0,0x27aace);
        plVar24 = plVar20 + 2;
        if ((long *)*plVar20 == plVar24) {
          local_3e8 = *plVar24;
          lStack_3e0 = plVar20[3];
          local_3f8 = &local_3e8;
        }
        else {
          local_3e8 = *plVar24;
          local_3f8 = (long *)*plVar20;
        }
        local_3f0 = plVar20[1];
        *plVar20 = (long)plVar24;
        plVar20[1] = 0;
        *(undefined1 *)(plVar20 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_438,(ulong)local_3f8);
        if (local_3f8 != &local_3e8) {
          operator_delete(local_3f8);
        }
        if (local_3b8 != local_3a8) {
          operator_delete(local_3b8);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"options:",8);
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1e8,local_438._M_dataplus._M_p,
                           local_438._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
      _Var39._M_p = local_438._M_dataplus._M_p;
      uVar29 = local_438._M_string_length & 0xffffffff;
      if (uVar29 == 0) {
        sVar15 = 1;
        pvVar12 = local_3c8;
      }
      else {
        sVar15 = (size_t)((int)local_438._M_string_length + 1);
        resize_buf_if_needed((char **)&local_3c8,&local_390,sVar15);
        pvVar12 = local_3c8;
        memcpy(local_3c8,_Var39._M_p,sVar15);
      }
      *(char *)((long)&(pvVar12->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + uVar29) = '\0';
      sVar15 = bin_text_write(model_file,(char *)pvVar12,sVar15,(stringstream *)local_1f8,text);
      iVar35 = (int)sVar15;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._M_dataplus._M_p != &local_438.field_2) {
        operator_delete(local_438._M_dataplus._M_p);
      }
      iVar9 = iVar9 + (int)sVar14;
      local_388._0_8_ = &PTR_add_002d38c8;
      std::__cxx11::stringstream::~stringstream((stringstream *)(local_388 + 8));
      std::ios_base::~ios_base(local_300);
    }
    bVar8 = version_struct::operator>=(local_400,"8.0.1");
    if (bVar8) {
      bVar8 = version_struct::operator>=(local_400,"8.0.2");
      if (bVar8) {
        uVar10 = io_buf::hash(model_file);
      }
      else {
        uVar11 = iVar35 + iVar9;
        uVar30 = uVar11;
        if ((int)uVar11 < 0) {
          uVar30 = uVar11 + 3;
        }
        pbVar25 = (byte *)((model_file->space)._begin + (int)(uVar30 & 0xfffffffc));
        uVar27 = 0;
        uVar26 = 0;
        uVar32 = 0;
        if (6 < uVar11 + 3) {
          lVar36 = (long)-((int)uVar30 >> 2);
          uVar32 = 0;
          do {
            uVar32 = ((uint)(*(int *)(pbVar25 + lVar36 * 4) * -0x3361d2af) >> 0x11 |
                     *(int *)(pbVar25 + lVar36 * 4) * 0x16a88000) * 0x1b873593 ^ uVar32;
            uVar32 = (uVar32 << 0xd | uVar32 >> 0x13) * 5 + 0xe6546b64;
            lVar36 = lVar36 + 1;
          } while (lVar36 != 0);
        }
        switch(uVar11 & 3) {
        case 3:
          uVar26 = (uint)pbVar25[2] << 0x10;
        case 2:
          uVar27 = uVar26 | (uint)pbVar25[1] << 8;
        case 1:
          uVar32 = uVar32 ^ ((*pbVar25 ^ uVar27) * -0x3361d2af >> 0x11 |
                            (*pbVar25 ^ uVar27) * 0x16a88000) * 0x1b873593;
        case 0:
          uVar11 = ((uVar32 ^ uVar11) >> 0x10 ^ uVar32 ^ uVar11) * -0x7a143595;
          uVar11 = (uVar11 >> 0xd ^ uVar11) * -0x3d4d51cb;
          uVar10 = uVar11 >> 0x10 ^ uVar11;
        }
      }
      local_438._M_dataplus._M_p._0_4_ = uVar10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"Checksum: ",10);
      poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)local_1e8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
      if (read) {
        bin_read(model_file,(char *)&local_438,4,"");
      }
      else {
        bin_text_write(model_file,(char *)&local_438,4,(stringstream *)local_1f8,text);
      }
      if (uVar10 != (uint32_t)local_438._M_dataplus._M_p) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_388);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_388 + 0x10),
                   "Checksum is inconsistent, file is possibly corrupted.",0x35);
        pvVar21 = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (pvVar21,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/parse_regressor.cc"
                   ,0x20b,&local_70);
        __cxa_throw(pvVar21,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
    }
    bVar8 = version_struct::operator>=(local_400,"8.0.2");
    if (bVar8) {
      model_file->_verify_hash = false;
      model_file->_hash = 0;
    }
    std::__cxx11::stringstream::~stringstream(local_1f8);
    std::ios_base::~ios_base((ios_base *)(local_1e8 + 0x70));
  }
  free(pvVar12);
  return;
}

Assistant:

void save_load_header(
    vw& all, io_buf& model_file, bool read, bool text, std::string& file_options, VW::config::options_i& options)
{
  char* buff2 = (char*)malloc(default_buf_size);
  size_t buf2_size = default_buf_size;

  try
  {
    if (model_file.files.size() > 0)
    {
      size_t bytes_read_write = 0;

      uint32_t v_length = (uint32_t)version.to_string().length() + 1;
      stringstream msg;
      msg << "Version " << version.to_string() << "\n";
      memcpy(buff2, version.to_string().c_str(), min(v_length, buf2_size));
      if (read)
      {
        v_length = (uint32_t)buf2_size;
        buff2[min(v_length, default_buf_size) - 1] = '\0';
      }
      bytes_read_write += bin_text_read_write(model_file, buff2, v_length, "", read, msg, text);
      all.model_file_ver = buff2;  // stored in all to check save_resume fix in gd
      VW::validate_version(all);

      if (all.model_file_ver >= VERSION_FILE_WITH_HEADER_CHAINED_HASH)
        model_file.verify_hash(true);

      if (all.model_file_ver >= VERSION_FILE_WITH_HEADER_ID)
      {
        v_length = (uint32_t)all.id.length() + 1;

        msg << "Id " << all.id << "\n";
        memcpy(buff2, all.id.c_str(), min(v_length, default_buf_size));
        if (read)
          v_length = default_buf_size;
        bytes_read_write += bin_text_read_write(model_file, buff2, v_length, "", read, msg, text);
        all.id = buff2;

        if (read && !options.was_supplied("id") && !all.id.empty())
        {
          file_options += " --id";
          file_options += " " + all.id;
        }
      }

      char model = 'm';

      bytes_read_write +=
          bin_text_read_write_fixed_validated(model_file, &model, 1, "file is not a model file", read, msg, text);

      msg << "Min label:" << all.sd->min_label << "\n";
      bytes_read_write += bin_text_read_write_fixed_validated(
          model_file, (char*)&all.sd->min_label, sizeof(all.sd->min_label), "", read, msg, text);

      msg << "Max label:" << all.sd->max_label << "\n";
      bytes_read_write += bin_text_read_write_fixed_validated(
          model_file, (char*)&all.sd->max_label, sizeof(all.sd->max_label), "", read, msg, text);

      msg << "bits:" << all.num_bits << "\n";
      uint32_t local_num_bits = all.num_bits;
      bytes_read_write += bin_text_read_write_fixed_validated(
          model_file, (char*)&local_num_bits, sizeof(local_num_bits), "", read, msg, text);

      if (read && !options.was_supplied("bit_precision"))
      {
        file_options += " --bit_precision";
        std::stringstream temp;
        temp << local_num_bits;
        file_options += " " + temp.str();
      }

      VW::validate_default_bits(all, local_num_bits);

      all.default_bits = false;
      all.num_bits = local_num_bits;

      VW::validate_num_bits(all);

      if (all.model_file_ver < VERSION_FILE_WITH_INTERACTIONS_IN_FO)
      {
        // -q, --cubic and --interactions are not saved in vw::file_options
        uint32_t pair_len = (uint32_t)all.pairs.size();

        msg << pair_len << " pairs: ";
        bytes_read_write +=
            bin_text_read_write_fixed_validated(model_file, (char*)&pair_len, sizeof(pair_len), "", read, msg, text);

        // TODO: validate pairs?
        for (size_t i = 0; i < pair_len; i++)
        {
          char pair[3] = {0, 0, 0};

          if (!read)
          {
            memcpy(pair, all.pairs[i].c_str(), 2);
            msg << all.pairs[i] << " ";
          }

          bytes_read_write += bin_text_read_write_fixed_validated(model_file, pair, 2, "", read, msg, text);
          if (read)
          {
            string temp(pair);
            if (count(all.pairs.begin(), all.pairs.end(), temp) == 0)
              all.pairs.push_back(temp);
          }
        }

        msg << "\n";
        bytes_read_write += bin_text_read_write_fixed_validated(model_file, nullptr, 0, "", read, msg, text);

        uint32_t triple_len = (uint32_t)all.triples.size();

        msg << triple_len << " triples: ";
        bytes_read_write += bin_text_read_write_fixed_validated(
            model_file, (char*)&triple_len, sizeof(triple_len), "", read, msg, text);

        // TODO: validate triples?
        for (size_t i = 0; i < triple_len; i++)
        {
          char triple[4] = {0, 0, 0, 0};

          if (!read)
          {
            msg << all.triples[i] << " ";
            memcpy(triple, all.triples[i].c_str(), 3);
          }
          bytes_read_write += bin_text_read_write_fixed_validated(model_file, triple, 3, "", read, msg, text);
          if (read)
          {
            string temp(triple);
            if (count(all.triples.begin(), all.triples.end(), temp) == 0)
              all.triples.push_back(temp);
          }
        }

        msg << "\n";
        bytes_read_write += bin_text_read_write_fixed_validated(model_file, nullptr, 0, "", read, msg, text);

        if (all.model_file_ver >=
            VERSION_FILE_WITH_INTERACTIONS)  // && < VERSION_FILE_WITH_INTERACTIONS_IN_FO (previous if)
        {
          // the only version that saves interacions among pairs and triples
          uint32_t len = (uint32_t)all.interactions.size();

          msg << len << " interactions: ";
          bytes_read_write +=
              bin_text_read_write_fixed_validated(model_file, (char*)&len, sizeof(len), "", read, msg, text);

          for (size_t i = 0; i < len; i++)
          {
            uint32_t inter_len = 0;
            if (!read)
            {
              inter_len = (uint32_t)all.interactions[i].size();
              msg << "len: " << inter_len << " ";
            }
            bytes_read_write += bin_text_read_write_fixed_validated(
                model_file, (char*)&inter_len, sizeof(inter_len), "", read, msg, text);
            if (!read)
            {
              memcpy(buff2, all.interactions[i].c_str(), inter_len);

              msg << "interaction: ";
              msg.write(all.interactions[i].c_str(), inter_len);
            }

            bytes_read_write += bin_text_read_write_fixed_validated(model_file, buff2, inter_len, "", read, msg, text);

            if (read)
            {
              string temp(buff2, inter_len);
              all.interactions.push_back(temp);
            }
          }

          msg << "\n";
          bytes_read_write += bin_text_read_write_fixed_validated(model_file, nullptr, 0, "", read, msg, text);
        }
        else  // < VERSION_FILE_WITH_INTERACTIONS
        {
          // pairs and triples may be restored but not reflected in interactions
          all.interactions.insert(std::end(all.interactions), std::begin(all.pairs), std::end(all.pairs));
          all.interactions.insert(std::end(all.interactions), std::begin(all.triples), std::end(all.triples));
        }
      }

      if (all.model_file_ver <= VERSION_FILE_WITH_RANK_IN_HEADER)
      {
        // to fix compatibility that was broken in 7.9
        uint32_t rank = 0;
        msg << "rank:" << rank << "\n";
        bytes_read_write +=
            bin_text_read_write_fixed_validated(model_file, (char*)&rank, sizeof(rank), "", read, msg, text);
        if (rank != 0)
        {
          if (!options.was_supplied("rank"))
          {
            file_options += " --rank";
            std::stringstream temp;
            temp << rank;
            file_options += " " + temp.str();
          }
          else
            all.trace_message << "WARNING: this model file contains 'rank: " << rank
                              << "' value but it will be ignored as another value specified via the command line."
                              << endl;
        }
      }

      msg << "lda:" << all.lda << "\n";
      bytes_read_write +=
          bin_text_read_write_fixed_validated(model_file, (char*)&all.lda, sizeof(all.lda), "", read, msg, text);

      // TODO: validate ngram_len?
      uint32_t ngram_len = (uint32_t)all.ngram_strings.size();
      msg << ngram_len << " ngram:";
      bytes_read_write +=
          bin_text_read_write_fixed_validated(model_file, (char*)&ngram_len, sizeof(ngram_len), "", read, msg, text);
      for (size_t i = 0; i < ngram_len; i++)
      {
        // have '\0' at the end for sure
        char ngram[4] = {0, 0, 0, 0};
        if (!read)
        {
          msg << all.ngram_strings[i] << " ";
          memcpy(ngram, all.ngram_strings[i].c_str(), min(3, all.ngram_strings[i].size()));
        }
        bytes_read_write += bin_text_read_write_fixed_validated(model_file, ngram, 3, "", read, msg, text);
        if (read)
        {
          std::string temp(ngram);
          all.ngram_strings.push_back(temp);

          file_options += " --ngram";
          file_options += " " + temp;
        }
      }

      msg << "\n";
      bytes_read_write += bin_text_read_write_fixed_validated(model_file, nullptr, 0, "", read, msg, text);

      // TODO: validate skips?
      uint32_t skip_len = (uint32_t)all.skip_strings.size();
      msg << skip_len << " skip:";
      bytes_read_write +=
          bin_text_read_write_fixed_validated(model_file, (char*)&skip_len, sizeof(skip_len), "", read, msg, text);

      for (size_t i = 0; i < skip_len; i++)
      {
        char skip[4] = {0, 0, 0, 0};
        if (!read)
        {
          msg << all.skip_strings[i] << " ";
          memcpy(skip, all.skip_strings[i].c_str(), min(3, all.skip_strings[i].size()));
        }

        bytes_read_write += bin_text_read_write_fixed_validated(model_file, skip, 3, "", read, msg, text);
        if (read)
        {
          std::string temp(skip);
          all.skip_strings.push_back(temp);

          file_options += " --skips";
          file_options += " " + temp;
        }
      }
      msg << "\n";
      bytes_read_write += bin_text_read_write_fixed_validated(model_file, nullptr, 0, "", read, msg, text);

      if (read)
      {
        uint32_t len;
        size_t ret = model_file.bin_read_fixed((char*)&len, sizeof(len), "");
        if (len > 104857600 /*sanity check: 100 Mb*/ || ret < sizeof(uint32_t))
          THROW("bad model format!");
        resize_buf_if_needed(buff2, buf2_size, len);
        bytes_read_write += model_file.bin_read_fixed(buff2, len, "") + ret;

        // Write out file options to caller.
        if (len > 0)
        {
          // There is a potential bug here if len is read out to be zero (e.g. corrupted file). If we naively
          // append buff2 into file_options it might contain old information and thus be invalid. Before, what
          // probably happened is boost::program_options did the right thing, but now we have to construct the
          // input to it where we do not know whether a particular option key can have multiple values or not.
          //
          // In some cases we end up with a string like: "--bit_precision 18 <something_not_an_int>", which will
          // cause a "bad program options value" exception, rather than the true "file is corrupted" issue. Only
          // pushing the contents of buff2 into file_options when it is valid will prevent this false error.
          file_options = file_options + " " + buff2;
        }
      }
      else
      {
        VW::config::options_serializer_boost_po serializer;
        for (auto const& option : options.get_all_options())
        {
          if (option->m_keep && options.was_supplied(option->m_name))
          {
            serializer.add(*option);
          }
        }

        auto serialized_keep_options = serializer.str();

        // We need to save our current PRG state
        if (all.save_resume && all.random_state != 0)
        {
          serialized_keep_options += " --random_seed";
          serialized_keep_options += " " + std::to_string(all.random_state);
        }

        msg << "options:" << serialized_keep_options << "\n";

        uint32_t len = (uint32_t)serialized_keep_options.length();
        if (len > 0)
          safe_memcpy(buff2, buf2_size, serialized_keep_options.c_str(), len + 1);
        *(buff2 + len) = 0;
        bytes_read_write += bin_text_read_write(model_file, buff2, len + 1,  // len+1 to write a \0
            "", read, msg, text);
      }

      // Read/write checksum if required by version
      if (all.model_file_ver >= VERSION_FILE_WITH_HEADER_HASH)
      {
        uint32_t check_sum = (all.model_file_ver >= VERSION_FILE_WITH_HEADER_CHAINED_HASH)
            ? model_file.hash()
            : (uint32_t)uniform_hash(model_file.space.begin(), bytes_read_write, 0);

        uint32_t check_sum_saved = check_sum;

        msg << "Checksum: " << check_sum << "\n";
        bin_text_read_write(model_file, (char*)&check_sum, sizeof(check_sum), "", read, msg, text);

        if (check_sum_saved != check_sum)
          THROW("Checksum is inconsistent, file is possibly corrupted.");
      }

      if (all.model_file_ver >= VERSION_FILE_WITH_HEADER_CHAINED_HASH)
      {
        model_file.verify_hash(false);
      }
    }
  }
  catch (...)
  {
    free(buff2);
    throw;
  }

  free(buff2);
}